

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_unary.h
# Opt level: O0

void __thiscall
lf::mesh::utils::
MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::refinement::MeshFunctionTransfer<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>_>
::MeshFunctionUnary(MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::refinement::MeshFunctionTransfer<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>_>
                    *this,MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::refinement::MeshFunctionTransfer<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
                          *param_2)

{
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::refinement::MeshFunctionTransfer<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
  *mf_local;
  MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::refinement::MeshFunctionTransfer<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>_>
  *this_local;
  
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::refinement::MeshFunctionTransfer<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
  ::MeshFunctionBinary(&this->mf_,param_2);
  return;
}

Assistant:

MeshFunctionUnary(OP op, MF mf) : op_(std::move(op)), mf_(std::move(mf)) {}